

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

int htmlSaveFileFormat(char *filename,xmlDocPtr cur,char *encoding,int format)

{
  xmlParserErrors xVar1;
  xmlCharEncodingHandlerPtr pxStack_40;
  int ret;
  xmlCharEncodingHandlerPtr handler;
  xmlOutputBufferPtr buf;
  char *pcStack_28;
  int format_local;
  char *encoding_local;
  xmlDocPtr cur_local;
  char *filename_local;
  
  pxStack_40 = (xmlCharEncodingHandlerPtr)0x0;
  if ((cur == (xmlDocPtr)0x0) || (filename == (char *)0x0)) {
    filename_local._4_4_ = -1;
  }
  else {
    buf._4_4_ = format;
    pcStack_28 = encoding;
    encoding_local = (char *)cur;
    cur_local = (xmlDocPtr)filename;
    xmlInitParser();
    xVar1 = htmlFindOutputEncoder(pcStack_28,&stack0xffffffffffffffc0);
    if (xVar1 == XML_ERR_OK) {
      if (pxStack_40 == (xmlCharEncodingHandlerPtr)0x0) {
        htmlSetMetaEncoding((htmlDocPtr)encoding_local,"UTF-8");
      }
      else {
        htmlSetMetaEncoding((htmlDocPtr)encoding_local,(xmlChar *)pxStack_40->name);
      }
      handler = (xmlCharEncodingHandlerPtr)
                xmlOutputBufferCreateFilename((char *)cur_local,pxStack_40,0);
      if ((xmlOutputBufferPtr)handler == (xmlOutputBufferPtr)0x0) {
        filename_local._4_4_ = 0;
      }
      else {
        htmlDocContentDumpFormatOutput
                  ((xmlOutputBufferPtr)handler,(xmlDocPtr)encoding_local,pcStack_28,buf._4_4_);
        filename_local._4_4_ = xmlOutputBufferClose((xmlOutputBufferPtr)handler);
      }
    }
    else {
      filename_local._4_4_ = -1;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int
htmlSaveFileFormat(const char *filename, xmlDocPtr cur,
	           const char *encoding, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    if (htmlFindOutputEncoder(encoding, &handler) != XML_ERR_OK)
        return(-1);
    if (handler != NULL)
        htmlSetMetaEncoding(cur, (const xmlChar *) handler->name);
    else
	htmlSetMetaEncoding(cur, (const xmlChar *) "UTF-8");

    /*
     * save the content to a temp buffer.
     */
    buf = xmlOutputBufferCreateFilename(filename, handler, 0);
    if (buf == NULL)
        return(0);

    htmlDocContentDumpFormatOutput(buf, cur, encoding, format);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}